

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O0

bool can_pk(CHAR_DATA *ch,CHAR_DATA *victim)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  long in_RSI;
  long in_RDI;
  int levelDif;
  int vxp;
  int xp;
  undefined4 in_stack_ffffffffffffffd8;
  bool local_1;
  
  if (in_RDI == in_RSI) {
    local_1 = true;
  }
  else if ((in_RDI == 0) || (in_RSI == 0)) {
    local_1 = false;
  }
  else {
    uVar4 = (int)*(short *)(in_RSI + 0x138) - (int)*(short *)(in_RDI + 0x138);
    if (0x7fffffff < uVar4) {
      uVar4 = -uVar4;
    }
    bVar3 = is_npc((CHAR_DATA *)CONCAT44(uVar4,in_stack_ffffffffffffffd8));
    if (((((!bVar3) &&
          (bVar3 = is_npc((CHAR_DATA *)CONCAT44(uVar4,in_stack_ffffffffffffffd8)), !bVar3)) &&
         (*(short *)(in_RDI + 0x2dc) < 1)) &&
        ((*(short *)(in_RSI + 0x2dc) < 1 && (0x16 < *(short *)(in_RDI + 0x138))))) &&
       ((0x16 < *(short *)(in_RSI + 0x138) && ((int)uVar4 < 10)))) {
      bVar3 = is_npc((CHAR_DATA *)CONCAT44(uVar4,in_stack_ffffffffffffffd8));
      if ((((!bVar3) &&
           (bVar3 = is_npc((CHAR_DATA *)CONCAT44(uVar4,in_stack_ffffffffffffffd8)), !bVar3)) &&
          (*(short *)(in_RDI + 0x138) == 0x33)) && (*(short *)(in_RSI + 0x138) == 0x33)) {
        return true;
      }
      iVar1 = *(int *)(in_RDI + 0x178);
      iVar2 = *(int *)(in_RSI + 0x178);
      if ((iVar1 < 10000) || (iVar2 < 10000)) {
        return false;
      }
      if (((int)*(short *)(in_RDI + 0x138) - (int)*(short *)(in_RSI + 0x138) < 0x17) &&
         (-0x17 < (int)*(short *)(in_RDI + 0x138) - (int)*(short *)(in_RSI + 0x138))) {
        if (((double)iVar1 * 0.7 < (double)iVar2) && ((double)iVar2 < (double)iVar1 * 1.3)) {
          return true;
        }
        if (((double)iVar2 * 0.7 < (double)iVar1) && ((double)iVar1 < (double)iVar2 * 1.3)) {
          return true;
        }
        return false;
      }
      return false;
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool can_pk(CHAR_DATA *ch, CHAR_DATA *victim)
{
	int xp, vxp;

	if (ch == victim)
		return true;

	if (ch == nullptr || victim == nullptr)
		return false;

	int levelDif = victim->level - ch->level;

	if (levelDif <= -1)
		levelDif *= -1;

	if (is_npc(ch)
		|| is_npc(victim)
		|| ch->ghost > 0
		|| victim->ghost > 0
		|| ch->level < MIN_LEVEL_TO_PK
		|| victim->level < MIN_LEVEL_TO_PK
		|| levelDif > 9) // abs(victim->level - ch->level)
	{
		return false;
	}

	if (!is_npc(ch)
		&& !is_npc(victim)
		&& ch->level == LEVEL_HERO
		&& victim->level == LEVEL_HERO)
	{
		return true;
	}

	xp = ch->exp;
	vxp = victim->exp;

	if (xp > MIN_PK_XP && vxp > MIN_PK_XP)
	{
		if (ch->level - victim->level < MIN_LEVEL_TO_PK && ch->level - victim->level > -MIN_LEVEL_TO_PK)
		{
			if (((xp * .7) < vxp) && ((xp * 1.3) > vxp))
				return true;
			else if (((vxp * .7) < xp) && ((vxp * 1.3) > xp))
				return true;
			else
				return false;
		}
		else
		{
			return false;
		}
	}
	else
	{
		return false;
	}
}